

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

bool __thiscall
QRegularExpressionMatch::hasCaptured(QRegularExpressionMatch *this,QAnyStringView name)

{
  long lVar1;
  QAnyStringView name_00;
  bool bVar2;
  int iVar3;
  QRegularExpressionPrivate *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_00000010;
  int nth;
  int nth_00;
  undefined4 in_stack_ffffffffffffffc8;
  
  nth_00 = (int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>::operator->
            ((QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> *)0x7300e4);
  QExplicitlySharedDataPointer<QRegularExpressionPrivate>::operator->
            ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x7300f0);
  name_00.m_size = (size_t)this;
  name_00.field_0.m_data = in_stack_00000010.m_data;
  iVar3 = QRegularExpressionPrivate::captureIndexForName(in_RSI,name_00);
  bVar2 = hasCaptured((QRegularExpressionMatch *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),nth_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QRegularExpressionMatch::hasCaptured(QAnyStringView name) const
{
    const int nth = d->regularExpression.d->captureIndexForName(name);
    return hasCaptured(nth);
}